

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

Result host_rewind_to_ticks(Host *host,Ticks ticks)

{
  Emulator *e;
  Result RVar1;
  Ticks TVar2;
  Result RVar3;
  JoypadCallbackInfo JVar4;
  
  if ((host->rewind_state).rewinding == FALSE) {
    __assert_fail("host->rewind_state.rewinding",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",
                  0x179,"Result host_rewind_to_ticks(Host *, Ticks)");
  }
  RVar1 = rewind_to_ticks(host->rewind_buffer,ticks,&(host->rewind_state).rewind_result);
  RVar3 = ERROR;
  if (RVar1 == OK) {
    e = (host->hook_ctx).e;
    RVar1 = emulator_read_state(e,&(host->rewind_state).rewind_result.file_data);
    if (RVar1 == OK) {
      TVar2 = emulator_get_ticks(e);
      if (TVar2 != ((host->rewind_state).rewind_result.info)->ticks) {
        __assert_fail("emulator_get_ticks(e) == result->info->ticks",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",
                      0x180,"Result host_rewind_to_ticks(Host *, Ticks)");
      }
      TVar2 = emulator_get_ticks(e);
      RVar3 = OK;
      if (TVar2 < ticks) {
        JVar4 = emulator_get_joypad_callback(e);
        emulator_set_joypad_playback_callback
                  (e,host->joypad_buffer,&(host->rewind_state).joypad_playback);
        host_run_until_ticks(host,ticks);
        emulator_set_joypad_callback(e,JVar4.callback,JVar4.user_data);
      }
    }
  }
  return RVar3;
}

Assistant:

Result host_rewind_to_ticks(Host* host, Ticks ticks) {
  assert(host->rewind_state.rewinding);

  RewindResult* result = &host->rewind_state.rewind_result;
  CHECK(SUCCESS(rewind_to_ticks(host->rewind_buffer, ticks, result)));

  Emulator* e = host_get_emulator(host);
  CHECK(SUCCESS(emulator_read_state(e, &result->file_data)));
  assert(emulator_get_ticks(e) == result->info->ticks);

  if (emulator_get_ticks(e) < ticks) {
    /* Save old joypad callback. */
    JoypadCallbackInfo old_jci = emulator_get_joypad_callback(e);
    emulator_set_joypad_playback_callback(e, host->joypad_buffer,
                                          &host->rewind_state.joypad_playback);
    host_run_until_ticks(host, ticks);
    /* Restore old joypad callback. */
    emulator_set_joypad_callback(e, old_jci.callback, old_jci.user_data);
  }

  return OK;
  ON_ERROR_RETURN;
}